

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZDICT_trainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t parameters)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ZDICT_cover_params_t parameters_00;
  undefined1 auVar4 [16];
  ZDICT_cover_params_t ZVar5;
  void *dictBuffer_00;
  size_t sVar6;
  COVER_map_pair_t *__s;
  uint uVar7;
  COVER_map_t activeDmers;
  COVER_ctx_t ctx;
  COVER_map_t local_b0;
  COVER_map_pair_t *local_98;
  void *local_90;
  COVER_ctx_t local_88;
  
  ZVar5 = parameters;
  g_displayLevel = parameters.zParams.notificationLevel;
  if (parameters.d != 0) {
    if (((parameters.d <= parameters.k) && (parameters.k != 0)) &&
       (parameters.k <= dictBufferCapacity)) {
      if (nbSamples == 0) {
        if ((int)parameters.zParams.notificationLevel < 1) {
          return 0xffffffffffffffb8;
        }
        ZDICT_trainFromBuffer_cover_cold_5();
        return 0xffffffffffffffb8;
      }
      if (dictBufferCapacity < 0x100) {
        if ((int)parameters.zParams.notificationLevel < 1) {
          return 0xffffffffffffffba;
        }
        ZDICT_trainFromBuffer_cover_cold_4();
        return 0xffffffffffffffba;
      }
      local_90 = dictBuffer;
      sVar6 = COVER_ctx_init(&local_88,samplesBuffer,samplesSizes,nbSamples,parameters.d,1.0);
      if (0xffffffffffffff88 < sVar6) {
        return sVar6;
      }
      COVER_warnOnSmallCorpus(dictBufferCapacity,local_88.suffixSize,g_displayLevel);
      uVar7 = (parameters.k - parameters.d) + 1;
      uVar1 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar7 = 4 << ((byte)uVar1 & 0x1f);
      local_b0.size = uVar7;
      local_b0.sizeLog = (uVar1 ^ 0xffffffe0) + 0x22;
      local_b0.sizeMask = uVar7 - 1;
      __s = (COVER_map_pair_t *)malloc((ulong)uVar7 << 3);
      local_b0.data = __s;
      if (__s != (COVER_map_pair_t *)0x0) {
        memset(__s,0xff,(ulong)uVar7 << 3);
        local_98 = __s;
        if (1 < g_displayLevel) {
          ZDICT_trainFromBuffer_cover_cold_1();
        }
        dictBuffer_00 = local_90;
        uVar2 = parameters.zParams._0_8_;
        uVar3 = parameters._40_8_;
        auVar4 = parameters._0_16_;
        parameters_00.splitPoint._0_4_ = 0;
        parameters_00.k = auVar4._0_4_;
        parameters_00.d = auVar4._4_4_;
        parameters_00.steps = auVar4._8_4_;
        parameters_00.nbThreads = auVar4._12_4_;
        parameters_00.splitPoint._4_4_ = 0x3ff00000;
        parameters_00.shrinkDict = parameters.shrinkDict;
        parameters_00.shrinkDictMaxRegression = parameters.shrinkDictMaxRegression;
        parameters_00.zParams.compressionLevel = (int)uVar2;
        parameters_00.zParams.notificationLevel = (int)((ulong)uVar2 >> 0x20);
        parameters_00._40_8_ = uVar3;
        sVar6 = COVER_buildDictionary
                          (&local_88,local_88.freqs,&local_b0,local_90,dictBufferCapacity,
                           parameters_00);
        sVar6 = ZDICT_finalizeDictionary
                          (dictBuffer_00,dictBufferCapacity,(void *)(sVar6 + (long)dictBuffer_00),
                           dictBufferCapacity - sVar6,samplesBuffer,samplesSizes,nbSamples,
                           ZVar5.zParams);
        if ((sVar6 < 0xffffffffffffff89) && (1 < g_displayLevel)) {
          ZDICT_trainFromBuffer_cover_cold_2();
        }
        COVER_ctx_destroy(&local_88);
        if (local_98 == (COVER_map_pair_t *)0x0) {
          return sVar6;
        }
        free(local_98);
        return sVar6;
      }
      local_b0.sizeLog = 0;
      local_b0.size = 0;
      if (0 < g_displayLevel) {
        ZDICT_trainFromBuffer_cover_cold_3();
      }
      COVER_ctx_destroy(&local_88);
      return 0xffffffffffffffc0;
    }
  }
  if (0 < (int)parameters.zParams.notificationLevel) {
    ZDICT_trainFromBuffer_cover_cold_6();
  }
  return 0xffffffffffffffd6;
}

Assistant:

ZDICTLIB_API size_t ZDICT_trainFromBuffer_cover(
    void *dictBuffer, size_t dictBufferCapacity,
    const void *samplesBuffer, const size_t *samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t parameters)
{
  BYTE* const dict = (BYTE*)dictBuffer;
  COVER_ctx_t ctx;
  COVER_map_t activeDmers;
  parameters.splitPoint = 1.0;
  /* Initialize global data */
  g_displayLevel = (int)parameters.zParams.notificationLevel;
  /* Checks */
  if (!COVER_checkParameters(parameters, dictBufferCapacity)) {
    DISPLAYLEVEL(1, "Cover parameters incorrect\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  /* Initialize context and activeDmers */
  {
    size_t const initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples,
                      parameters.d, parameters.splitPoint);
    if (ZSTD_isError(initVal)) {
      return initVal;
    }
  }
  COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, g_displayLevel);
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    COVER_ctx_destroy(&ctx);
    return ERROR(memory_allocation);
  }

  DISPLAYLEVEL(2, "Building dictionary\n");
  {
    const size_t tail =
        COVER_buildDictionary(&ctx, ctx.freqs, &activeDmers, dictBuffer,
                              dictBufferCapacity, parameters);
    const size_t dictionarySize = ZDICT_finalizeDictionary(
        dict, dictBufferCapacity, dict + tail, dictBufferCapacity - tail,
        samplesBuffer, samplesSizes, nbSamples, parameters.zParams);
    if (!ZSTD_isError(dictionarySize)) {
      DISPLAYLEVEL(2, "Constructed dictionary of size %u\n",
                   (unsigned)dictionarySize);
    }
    COVER_ctx_destroy(&ctx);
    COVER_map_destroy(&activeDmers);
    return dictionarySize;
  }
}